

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Vec_Int_t * Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,int nFrames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Id;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar4;
  Wlc_Obj_t *pWVar5;
  Wlc_Obj_t *pWVar6;
  Wlc_Obj_t *pWVar7;
  int iVar8;
  
  p_00 = Vec_IntAlloc(100);
  for (iVar8 = 1; iVar8 < p->iObj; iVar8 = iVar8 + 1) {
    pWVar4 = Wlc_NtkObj(p,iVar8);
    pWVar4->field_0x1 = pWVar4->field_0x1 & 0xfe;
  }
  iVar8 = 0;
  do {
    if (vMemObjsClean->nSize <= iVar8) {
      iVar8 = 1;
      do {
        if (p->iObj <= iVar8) {
          return p_00;
        }
        pWVar4 = Wlc_NtkObj(p,iVar8);
        iVar8 = iVar8 + 1;
      } while ((pWVar4->field_0x1 & 1) == 0);
      __assert_fail("pObj->Mark2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                    ,0x4e4,"Vec_Int_t *Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *, Vec_Int_t *, int)");
    }
    iVar1 = Vec_IntEntry(vMemObjsClean,iVar8);
    pWVar4 = Wlc_NtkObj(p,iVar1);
    if ((undefined1  [24])((undefined1  [24])*pWVar4 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x36) {
      for (iVar1 = 0; iVar1 < vMemObjsClean->nSize; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(vMemObjsClean,iVar1);
        pWVar5 = Wlc_NtkObj(p,iVar2);
        if ((*(ushort *)pWVar5 & 0x3d) == 1) {
          *(ushort *)pWVar5 = *(ushort *)pWVar5 | 0x100;
          for (iVar2 = 0; iVar2 < vMemObjsClean->nSize; iVar2 = iVar2 + 1) {
            iVar3 = Vec_IntEntry(vMemObjsClean,iVar2);
            pWVar6 = Wlc_NtkObj(p,iVar3);
            if (pWVar6 != pWVar5) {
              if ((pWVar6->field_0x1 & 1) != 0) {
                __assert_fail("pObj->Mark2 == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x4d9,
                              "Vec_Int_t *Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *, Vec_Int_t *, int)");
              }
              for (iVar3 = 0; iVar3 < (int)pWVar6->nFanins; iVar3 = iVar3 + 1) {
                Id = Wlc_ObjFaninId(pWVar6,iVar3);
                pWVar7 = Wlc_NtkObj(p,Id);
                *(ushort *)pWVar6 = *(ushort *)pWVar6 | *(ushort *)pWVar7 & 0x100;
              }
            }
          }
          if ((pWVar4->field_0x1 & 1) != 0) {
            pWVar6 = p->pObjs;
            Vec_IntPush(p_00,(int)(((long)pWVar4 - (long)pWVar6) / 0x18));
            Vec_IntPush(p_00,(int)(((long)pWVar5 - (long)pWVar6) / 0x18));
            Vec_IntPush(p_00,-1);
          }
          for (iVar2 = 0; iVar2 < vMemObjsClean->nSize; iVar2 = iVar2 + 1) {
            iVar3 = Vec_IntEntry(vMemObjsClean,iVar2);
            pWVar5 = Wlc_NtkObj(p,iVar3);
            pWVar5->field_0x1 = pWVar5->field_0x1 & 0xfe;
          }
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Wlc_NtkFindReachablePiFo( Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, int nFrames )
{
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pObjR, * pObjI, * pObj; 
    int i, j, k, f, fFanin;
    Wlc_NtkForEachObj( p, pObj, i )
        pObj->Mark2 = 0;
    // go through read ports
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObjR, i ) if ( Wlc_ObjIsRead(pObjR) )
    {
        // go through memory CIs
        Wlc_NtkForEachObjVec( vMemObjsClean, p, pObjI, j ) if ( Wlc_ObjIsCi(pObjI) )
        {
            // propagate bit from CI to READ
            pObjI->Mark2 = 1;
            Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
            {
                if ( pObj == pObjI )
                    continue;
                assert( pObj->Mark2 == 0 );
                Wlc_ObjForEachFanin( pObj, fFanin, f )
                    pObj->Mark2 |= Wlc_NtkObj(p, fFanin)->Mark2;
            }
            if ( pObjR->Mark2 )
                Vec_IntPushThree( vRes, Wlc_ObjId(p, pObjR), Wlc_ObjId(p, pObjI), -1 );
            Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
                pObj->Mark2 = 0;
        }
    }
    Wlc_NtkForEachObj( p, pObj, i )
        assert( pObj->Mark2 == 0 );
    return vRes;
}